

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yy_range(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int yythunkpos21;
  int yypos21;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar5 = G->pos;
  iVar3 = G->thunkpos;
  iVar4 = yy_char(G);
  if (((iVar4 == 0) || (iVar4 = yymatchChar(G,0x2d), iVar4 == 0)) ||
     (iVar4 = yy_char(G), iVar4 == 0)) {
    G->pos = iVar5;
    G->thunkpos = iVar3;
    iVar5 = yy_char(G);
    if (iVar5 == 0) {
      G->pos = iVar1;
      G->thunkpos = iVar2;
      return 0;
    }
  }
  return 1;
}

Assistant:

YY_RULE(int) yy_range(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "range"));

  {  int yypos21= G->pos, yythunkpos21= G->thunkpos;  if (!yy_char(G))  goto l22;
  if (!yymatchChar(G, '-')) goto l22;
  if (!yy_char(G))  goto l22;
  goto l21;
  l22:;	  G->pos= yypos21; G->thunkpos= yythunkpos21;  if (!yy_char(G))  goto l20;

  }
  l21:;	  yyprintf((stderr, "  ok   range"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l20:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "range"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}